

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
SMBusSimulationDataGenerator::OutputBit(SMBusSimulationDataGenerator *this,BitState state)

{
  uint uVar1;
  
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mSMBDAT);
  uVar1 = (int)this + 0x18;
  ClockGenerator::AdvanceByTimeS(4.9999999999999996e-06);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByTimeS(9.999999999999999e-06);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByTimeS(4.9999999999999996e-06);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  return;
}

Assistant:

void SMBusSimulationDataGenerator::OutputBit( BitState state )
{
    if( state == BIT_HIGH )
        mSMBDAT->TransitionIfNeeded( BIT_HIGH );
    else
        mSMBDAT->TransitionIfNeeded( BIT_LOW );

    AdvanceAllBySec( ONE_US * 5 );

    mSMBCLK->Transition(); // go high
    AdvanceAllBySec( ONE_US * 10 );
    mSMBCLK->Transition(); // go low

    AdvanceAllBySec( ONE_US * 5 );
}